

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pointer __thiscall
google::protobuf::internal::
MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
::allocate(MapAllocator<std::_Rb_tree_node<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
           *this,size_type n,void *param_2)

{
  pointer pvVar1;
  
  if (this->arena_ != (Arena *)0x0) {
    pvVar1 = (pointer)Arena::AllocateAlignedWithHook
                                (this->arena_,n * 0x30,(type_info *)&unsigned_char::typeinfo);
    return pvVar1;
  }
  pvVar1 = (pointer)operator_new(n * 0x30);
  return pvVar1;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = nullptr) {
    // If arena is not given, malloc needs to be called which doesn't
    // construct element object.
    if (arena_ == nullptr) {
      return static_cast<pointer>(::operator new(n * sizeof(value_type)));
    } else {
      return reinterpret_cast<pointer>(
          Arena::CreateArray<uint8_t>(arena_, n * sizeof(value_type)));
    }
  }